

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

int __thiscall CVmObjClass::get_superclass_count(CVmObjClass *this,vm_obj_id_t param_2)

{
  vm_meta_entry_t *pvVar1;
  undefined4 in_ESI;
  vm_meta_entry_t *entry;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  pvVar1 = get_meta_entry((CVmObjClass *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (pvVar1 == (vm_meta_entry_t *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*pvVar1->meta_->_vptr_CVmMetaclass[8])();
  }
  return local_4;
}

Assistant:

int CVmObjClass::get_superclass_count(VMG_ vm_obj_id_t) const
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* 
     *   if we have a valid entry, ask the metaclass object to tell us the
     *   superclass count 
     */
    if (entry != 0)
        return entry->meta_->get_supermeta_count(vmg0_);
    else
        return 0;
}